

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

void __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::AssignShaders
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this)

{
  RayTracingGeneralShaderGroup *pRVar1;
  pointer pRVar2;
  ulong uVar3;
  RayTracingTriangleHitShaderGroup *pRVar4;
  RayTracingProceduralHitShaderGroup *pRVar5;
  IShader *pIVar6;
  long lVar7;
  ulong uVar8;
  string local_50;
  
  if ((this->CreateInfo).GeneralShaderCount != 0) {
    lVar7 = 8;
    uVar8 = 0;
    do {
      pRVar1 = (this->CreateInfo).pGeneralShaders;
      pRVar2 = (this->Shaders).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&pRVar1->Name + lVar7);
      if (uVar3 < (ulong)((long)(this->Shaders).
                                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)) {
        pIVar6 = pRVar2[uVar3].m_pObject;
      }
      else {
        if (uVar3 != 0xffffffff) {
          FormatString<char[23]>(&local_50,(char (*) [23])"Failed to remap shader");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                     ,0x169);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar6 = (IShader *)0x0;
      }
      *(IShader **)((long)&pRVar1->Name + lVar7) = pIVar6;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < (this->CreateInfo).GeneralShaderCount);
  }
  if ((this->CreateInfo).TriangleHitShaderCount != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pRVar4 = (this->CreateInfo).pTriangleHitShaders;
      pRVar2 = (this->Shaders).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&pRVar4->pClosestHitShader + lVar7);
      if (uVar3 < (ulong)((long)(this->Shaders).
                                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)) {
        pIVar6 = pRVar2[uVar3].m_pObject;
      }
      else {
        if (uVar3 != 0xffffffff) {
          FormatString<char[23]>(&local_50,(char (*) [23])"Failed to remap shader");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                     ,0x169);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar6 = (IShader *)0x0;
      }
      *(IShader **)((long)&pRVar4->pClosestHitShader + lVar7) = pIVar6;
      pRVar4 = (this->CreateInfo).pTriangleHitShaders;
      pRVar2 = (this->Shaders).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&pRVar4->pAnyHitShader + lVar7);
      if (uVar3 < (ulong)((long)(this->Shaders).
                                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)) {
        pIVar6 = pRVar2[uVar3].m_pObject;
      }
      else {
        if (uVar3 != 0xffffffff) {
          FormatString<char[23]>(&local_50,(char (*) [23])"Failed to remap shader");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                     ,0x169);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar6 = (IShader *)0x0;
      }
      *(IShader **)((long)&pRVar4->pAnyHitShader + lVar7) = pIVar6;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 < (this->CreateInfo).TriangleHitShaderCount);
  }
  if ((this->CreateInfo).ProceduralHitShaderCount != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pRVar5 = (this->CreateInfo).pProceduralHitShaders;
      pRVar2 = (this->Shaders).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&pRVar5->pIntersectionShader + lVar7);
      if (uVar3 < (ulong)((long)(this->Shaders).
                                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)) {
        pIVar6 = pRVar2[uVar3].m_pObject;
      }
      else {
        if (uVar3 != 0xffffffff) {
          FormatString<char[23]>(&local_50,(char (*) [23])"Failed to remap shader");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                     ,0x169);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar6 = (IShader *)0x0;
      }
      *(IShader **)((long)&pRVar5->pIntersectionShader + lVar7) = pIVar6;
      pRVar5 = (this->CreateInfo).pProceduralHitShaders;
      pRVar2 = (this->Shaders).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&pRVar5->pClosestHitShader + lVar7);
      if (uVar3 < (ulong)((long)(this->Shaders).
                                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)) {
        pIVar6 = pRVar2[uVar3].m_pObject;
      }
      else {
        if (uVar3 != 0xffffffff) {
          FormatString<char[23]>(&local_50,(char (*) [23])"Failed to remap shader");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                     ,0x169);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar6 = (IShader *)0x0;
      }
      *(IShader **)((long)&pRVar5->pClosestHitShader + lVar7) = pIVar6;
      pRVar5 = (this->CreateInfo).pProceduralHitShaders;
      pRVar2 = (this->Shaders).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)&pRVar5->pAnyHitShader + lVar7);
      if (uVar3 < (ulong)((long)(this->Shaders).
                                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)) {
        pIVar6 = pRVar2[uVar3].m_pObject;
      }
      else {
        if (uVar3 != 0xffffffff) {
          FormatString<char[23]>(&local_50,(char (*) [23])"Failed to remap shader");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                     ,0x169);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pIVar6 = (IShader *)0x0;
      }
      *(IShader **)((long)&pRVar5->pAnyHitShader + lVar7) = pIVar6;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar8 < (this->CreateInfo).ProceduralHitShaderCount);
  }
  return;
}

Assistant:

void DearchiverBase::PSOData<RayTracingPipelineStateCreateInfo>::AssignShaders()
{
    auto RemapShader = [this](IShader* const& inoutShader) //
    {
        size_t ShaderIndex = BitCast<size_t>(inoutShader);
        if (ShaderIndex < Shaders.size())
            const_cast<IShader*&>(inoutShader) = Shaders[ShaderIndex];
        else
        {
            VERIFY(ShaderIndex == ~0u, "Failed to remap shader");
            const_cast<IShader*&>(inoutShader) = nullptr;
        }
    };

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        RemapShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        RemapShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        RemapShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        RemapShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        RemapShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        RemapShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }
}